

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O0

var __thiscall cs::struct_builder::operator()(struct_builder *this)

{
  bool bVar1;
  type_info *this_00;
  undefined8 uVar2;
  proxy *in_RDI;
  exception *e;
  exception *e_1;
  statement_base **ptr;
  iterator __end1;
  iterator __begin1;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *__range1;
  var parent;
  type_t *t;
  var builder;
  scope_guard scope;
  undefined1 in_stack_000006cf;
  iterator *in_stack_000006d0;
  runtime_type *in_stack_000006d8;
  _Self *in_stack_fffffffffffffd88;
  runtime_error *in_stack_fffffffffffffd90;
  function<cs_impl::any_()> *in_stack_fffffffffffffd98;
  type_info *in_stack_fffffffffffffda0;
  domain_type *in_stack_fffffffffffffda8;
  any *in_stack_fffffffffffffdb0;
  type_id *in_stack_fffffffffffffdb8;
  undefined1 in_stack_fffffffffffffdc7;
  domain_type *in_stack_fffffffffffffdc8;
  domain_manager *in_stack_fffffffffffffdd0;
  any *in_stack_fffffffffffffe10;
  undefined1 in_stack_ffffffffffffff2f;
  var *in_stack_ffffffffffffff30;
  undefined6 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff3e;
  allocator in_stack_ffffffffffffff3f;
  domain_manager *in_stack_ffffffffffffff40;
  allocator local_99;
  string local_98 [46];
  undefined1 local_6a;
  allocator local_69;
  string local_68 [32];
  type_t *local_48;
  tree_node *local_40;
  iterator local_20 [4];
  
  scope_guard::scope_guard
            ((scope_guard *)in_stack_fffffffffffffd90,(context_t *)in_stack_fffffffffffffd88);
  local_20[0] = tree_type<cs::token_base_*>::root
                          ((tree_type<cs::token_base_*> *)in_stack_fffffffffffffd88);
  bVar1 = tree_type<cs::token_base_*>::iterator::usable(local_20);
  if (bVar1) {
    std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x2d5195);
    std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x2d51a1);
    local_40 = (tree_node *)
               tree_type<cs::token_base_*>::root
                         ((tree_type<cs::token_base_*> *)in_stack_fffffffffffffd88);
    runtime_type::parse_expr(in_stack_000006d8,in_stack_000006d0,(bool)in_stack_000006cf);
    cs_impl::any::type((any *)in_stack_fffffffffffffd90);
    bVar1 = std::type_info::operator==
                      (in_stack_fffffffffffffda0,(type_info *)in_stack_fffffffffffffd98);
    if (!bVar1) {
      uVar2 = __cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&stack0xffffffffffffff40,"Target is not a type.",
                 (allocator *)&stack0xffffffffffffff3f);
      runtime_error::runtime_error(in_stack_fffffffffffffd90,(string *)in_stack_fffffffffffffd88);
      __cxa_throw(uVar2,&runtime_error::typeinfo,runtime_error::~runtime_error);
    }
    local_48 = cs_impl::any::const_val<cs::type_t>(in_stack_fffffffffffffe10);
    bVar1 = type_id::operator==((type_id *)in_stack_fffffffffffffd90,
                                (type_id *)in_stack_fffffffffffffd88);
    if (bVar1) {
      local_6a = 1;
      uVar2 = __cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_68,"Can not inherit itself.",&local_69);
      runtime_error::runtime_error(in_stack_fffffffffffffd90,(string *)in_stack_fffffffffffffd88);
      local_6a = 0;
      __cxa_throw(uVar2,&runtime_error::typeinfo,runtime_error::~runtime_error);
    }
    std::function<cs_impl::any_()>::operator()(in_stack_fffffffffffffd98);
    this_00 = cs_impl::any::type((any *)in_stack_fffffffffffffd90);
    bVar1 = std::type_info::operator==
                      (in_stack_fffffffffffffda0,(type_info *)in_stack_fffffffffffffd98);
    if (!bVar1) {
      uVar2 = __cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_98,"Target is not a struct.",&local_99);
      runtime_error::runtime_error(in_stack_fffffffffffffd90,(string *)in_stack_fffffffffffffd88);
      __cxa_throw(uVar2,&runtime_error::typeinfo,runtime_error::~runtime_error);
    }
    cs_impl::any::protect((any *)in_stack_fffffffffffffdd0);
    std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x2d540b);
    std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x2d5417);
    cs_impl::any::const_val<cs::structure>((any *)this_00);
    structure::get_domain((structure *)0x2d5444);
    domain_manager::involve_domain
              (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,(bool)in_stack_fffffffffffffdc7);
    std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x2d546b);
    std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x2d5477);
    domain_manager::add_var_no_return<char_const(&)[7]>
              (in_stack_ffffffffffffff40,
               (char (*) [7])
               CONCAT17(in_stack_ffffffffffffff3f,
                        CONCAT16(in_stack_ffffffffffffff3e,in_stack_ffffffffffffff38)),
               in_stack_ffffffffffffff30,(bool)in_stack_ffffffffffffff2f);
    cs_impl::any::~any((any *)0x2d559b);
    cs_impl::any::~any((any *)0x2d5696);
  }
  std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::begin
            ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)
             in_stack_fffffffffffffd88);
  std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::end
            ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)
             in_stack_fffffffffffffd88);
  while (bVar1 = std::operator!=((_Self *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88),
        bVar1) {
    std::_Deque_iterator<cs::statement_base_*,_cs::statement_base_*&,_cs::statement_base_**>::
    operator*((_Deque_iterator<cs::statement_base_*,_cs::statement_base_*&,_cs::statement_base_**> *
              )&stack0xffffffffffffff10);
    statement_base::run((statement_base *)in_stack_fffffffffffffd90);
    std::_Deque_iterator<cs::statement_base_*,_cs::statement_base_*&,_cs::statement_base_**>::
    operator++((_Deque_iterator<cs::statement_base_*,_cs::statement_base_*&,_cs::statement_base_**>
                *)in_stack_fffffffffffffd90);
  }
  scope_guard::get((scope_guard *)0x2d59fd);
  cs_impl::any::make<cs::structure,cs::type_id&,std::__cxx11::string&,cs::domain_type_const&>
            (in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  scope_guard::~scope_guard((scope_guard *)0x2d5a2f);
  return (var)in_RDI;
}

Assistant:

var struct_builder::operator()()
	{
		scope_guard scope(mContext);
		if (mParent.root().usable()) {
			var builder = mContext->instance->parse_expr(mParent.root());
			if (builder.type() == typeid(type_t)) {
				const auto &t = builder.const_val<type_t>();
				if (mTypeId == t.id)
					throw runtime_error("Can not inherit itself.");
				var parent = t.constructor();
				if (parent.type() == typeid(structure)) {
					parent.protect();
					mContext->instance->storage.involve_domain(parent.const_val<structure>().get_domain());
					mContext->instance->storage.add_var_no_return("parent", parent, true);
				}
				else
					throw runtime_error("Target is not a struct.");
			}
			else
				throw runtime_error("Target is not a type.");
		}
		for (auto &ptr: this->mMethod) {
			try {
				ptr->run();
			}
			catch (const cs::exception &e) {
				throw e;
			}
			catch (const std::exception &e) {
				throw exception(ptr->get_line_num(), ptr->get_file_path(), ptr->get_raw_code(), e.what());
			}
		}
		return var::make<structure>(this->mTypeId, this->mName, scope.get());
	}